

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_stack.c
# Opt level: O1

void l2_stack_push_back(l2_stack *stack,void *data)

{
  l2_storage *storage_p;
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  
  l2_assert_func((long)stack,L2_INTERNAL_ERROR_NULL_POINTER,"l2_stack_push_back",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_tpl/l2_stack.c"
                 ,0x1c);
  uVar2 = stack->max_size;
  if (uVar2 <= stack->size) {
    storage_p = g_parser_p->storage_p;
    stack->max_size = uVar2 + 100;
    pvVar1 = l2_storage_mem_resize
                       (storage_p,stack->stack_p,stack->single_size * uVar2,
                        (uVar2 + 100) * stack->single_size);
    stack->stack_p = pvVar1;
  }
  uVar2 = stack->single_size;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      *(undefined1 *)((long)stack->stack_p + uVar3 + uVar2 * stack->size) =
           *(undefined1 *)((long)data + uVar3);
      uVar3 = uVar3 + 1;
      uVar2 = stack->single_size;
    } while (uVar3 < uVar2);
  }
  stack->size = stack->size + 1;
  return;
}

Assistant:

void l2_stack_push_back(l2_stack *stack, const void *data) {
    l2_assert(stack, L2_INTERNAL_ERROR_NULL_POINTER);
    int i;
    if (stack->size >= stack->max_size)
        stack->stack_p = l2_storage_mem_resize(g_parser_p->storage_p, stack->stack_p, stack->max_size * stack->single_size, (stack->max_size += 100) * stack->single_size);
    for (i = 0; i < stack->single_size; i++) {
        ((char *)(stack->stack_p))[stack->size * stack->single_size + i] = ((char *)data)[i];
    }
    stack->size += 1;
}